

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O2

int ECDSA_SIG_marshal(CBB *cbb,ECDSA_SIG *sig)

{
  int iVar1;
  CBB child;
  
  iVar1 = CBB_add_asn1(cbb,&child,0x20000010);
  if ((((iVar1 != 0) && (iVar1 = BN_marshal_asn1(&child,sig->r), iVar1 != 0)) &&
      (iVar1 = BN_marshal_asn1(&child,sig->s), iVar1 != 0)) && (iVar1 = CBB_flush(cbb), iVar1 != 0))
  {
    return 1;
  }
  ERR_put_error(0x1a,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                ,0x111);
  return 0;
}

Assistant:

int ECDSA_SIG_marshal(CBB *cbb, const ECDSA_SIG *sig) {
  CBB child;
  if (!CBB_add_asn1(cbb, &child, CBS_ASN1_SEQUENCE) ||
      !BN_marshal_asn1(&child, sig->r) || !BN_marshal_asn1(&child, sig->s) ||
      !CBB_flush(cbb)) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_ENCODE_ERROR);
    return 0;
  }
  return 1;
}